

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base64.c
# Opt level: O0

int mbedtls_base64_decode(uchar *dst,size_t dlen,size_t *olen,uchar *src,size_t slen)

{
  uint uVar1;
  ulong uVar2;
  bool bVar3;
  uchar *local_58;
  uchar *p;
  uint32_t x;
  uint32_t j;
  size_t n;
  size_t i;
  size_t slen_local;
  uchar *src_local;
  size_t *olen_local;
  size_t dlen_local;
  uchar *dst_local;
  
  p._4_4_ = 0;
  _x = 0;
  for (n = 0; n < slen; n = n + 1) {
    p._0_4_ = 0;
    while( true ) {
      bVar3 = false;
      if (n < slen) {
        bVar3 = src[n] == ' ';
      }
      if (!bVar3) break;
      n = n + 1;
      p._0_4_ = (uint)p + 1;
    }
    if (n == slen) break;
    if ((((slen - n < 2) || (src[n] != '\r')) || (src[n + 1] != '\n')) && (src[n] != '\n')) {
      if ((uint)p != 0) {
        return -0x2c;
      }
      if ((src[n] == '=') && (p._4_4_ = p._4_4_ + 1, 2 < p._4_4_)) {
        return -0x2c;
      }
      if ((0x7f < src[n]) ||
         ("\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f>\x7f\x7f\x7f?456789:;<=\x7f\x7f\x7f@\x7f\x7f\x7f"
          [src[n]] == '\x7f')) {
        return -0x2c;
      }
      if (("\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f>\x7f\x7f\x7f?456789:;<=\x7f\x7f\x7f@\x7f\x7f\x7f"
           [src[n]] < 0x40) && (p._4_4_ != 0)) {
        return -0x2c;
      }
      _x = _x + 1;
    }
  }
  if (_x == 0) {
    *olen = 0;
    dst_local._4_4_ = 0;
  }
  else {
    uVar2 = ((_x >> 3) * 6 + ((_x & 7) * 6 + 7 >> 3)) - (ulong)p._4_4_;
    if ((dst == (uchar *)0x0) || (dlen < uVar2)) {
      *olen = uVar2;
      dst_local._4_4_ = -0x2a;
    }
    else {
      p._4_4_ = 3;
      p._0_4_ = 0;
      _x = 0;
      local_58 = dst;
      slen_local = (size_t)src;
      for (; n != 0; n = n - 1) {
        if (((*(char *)slen_local != '\r') && (*(char *)slen_local != '\n')) &&
           (*(char *)slen_local != ' ')) {
          p._4_4_ = p._4_4_ - ("\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f>\x7f\x7f\x7f?456789:;<=\x7f\x7f\x7f@\x7f\x7f\x7f"
                               [*(byte *)slen_local] == '@');
          uVar1 = (uint)p << 6;
          p._0_4_ = uVar1 | "\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f>\x7f\x7f\x7f?456789:;<=\x7f\x7f\x7f@\x7f\x7f\x7f"
                            [*(byte *)slen_local] & 0x3f;
          _x = _x + 1;
          if (_x == 4) {
            _x = 0;
            if (p._4_4_ != 0) {
              *local_58 = (uchar)(uVar1 >> 0x10);
              local_58 = local_58 + 1;
            }
            if (1 < p._4_4_) {
              *local_58 = (uchar)(uVar1 >> 8);
              local_58 = local_58 + 1;
            }
            if (2 < p._4_4_) {
              *local_58 = (uchar)(uint)p;
              local_58 = local_58 + 1;
            }
          }
        }
        slen_local = slen_local + 1;
      }
      *olen = (long)local_58 - (long)dst;
      dst_local._4_4_ = 0;
    }
  }
  return dst_local._4_4_;
}

Assistant:

int mbedtls_base64_decode( unsigned char *dst, size_t dlen, size_t *olen,
                   const unsigned char *src, size_t slen )
{
    size_t i, n;
    uint32_t j, x;
    unsigned char *p;

    /* First pass: check for validity and get output length */
    for( i = n = j = 0; i < slen; i++ )
    {
        /* Skip spaces before checking for EOL */
        x = 0;
        while( i < slen && src[i] == ' ' )
        {
            ++i;
            ++x;
        }

        /* Spaces at end of buffer are OK */
        if( i == slen )
            break;

        if( ( slen - i ) >= 2 &&
            src[i] == '\r' && src[i + 1] == '\n' )
            continue;

        if( src[i] == '\n' )
            continue;

        /* Space inside a line is an error */
        if( x != 0 )
            return( MBEDTLS_ERR_BASE64_INVALID_CHARACTER );

        if( src[i] == '=' && ++j > 2 )
            return( MBEDTLS_ERR_BASE64_INVALID_CHARACTER );

        if( src[i] > 127 || base64_dec_map[src[i]] == 127 )
            return( MBEDTLS_ERR_BASE64_INVALID_CHARACTER );

        if( base64_dec_map[src[i]] < 64 && j != 0 )
            return( MBEDTLS_ERR_BASE64_INVALID_CHARACTER );

        n++;
    }

    if( n == 0 )
    {
        *olen = 0;
        return( 0 );
    }

    /* The following expression is to calculate the following formula without
     * risk of integer overflow in n:
     *     n = ( ( n * 6 ) + 7 ) >> 3;
     */
    n = ( 6 * ( n >> 3 ) ) + ( ( 6 * ( n & 0x7 ) + 7 ) >> 3 );
    n -= j;

    if( dst == NULL || dlen < n )
    {
        *olen = n;
        return( MBEDTLS_ERR_BASE64_BUFFER_TOO_SMALL );
    }

   for( j = 3, n = x = 0, p = dst; i > 0; i--, src++ )
   {
        if( *src == '\r' || *src == '\n' || *src == ' ' )
            continue;

        j -= ( base64_dec_map[*src] == 64 );
        x  = ( x << 6 ) | ( base64_dec_map[*src] & 0x3F );

        if( ++n == 4 )
        {
            n = 0;
            if( j > 0 ) *p++ = (unsigned char)( x >> 16 );
            if( j > 1 ) *p++ = (unsigned char)( x >>  8 );
            if( j > 2 ) *p++ = (unsigned char)( x       );
        }
    }

    *olen = p - dst;

    return( 0 );
}